

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void h2v1_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  JSAMPLE JVar1;
  JSAMPARRAY ppJVar2;
  JSAMPROW pJVar3;
  JSAMPLE *pJVar4;
  int local_54;
  int outrow;
  JSAMPROW outend;
  JSAMPROW pJStack_40;
  JSAMPLE invalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY output_data;
  JSAMPARRAY *output_data_ptr_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  ppJVar2 = *output_data_ptr;
  for (local_54 = 0; local_54 < cinfo->max_v_samp_factor; local_54 = local_54 + 1) {
    pJStack_40 = ppJVar2[local_54];
    pJVar3 = pJStack_40 + cinfo->output_width;
    outptr = input_data[local_54];
    while (pJStack_40 < pJVar3) {
      JVar1 = *outptr;
      pJVar4 = pJStack_40 + 1;
      *pJStack_40 = JVar1;
      pJStack_40 = pJStack_40 + 2;
      *pJVar4 = JVar1;
      outptr = outptr + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_upsample (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JSAMPARRAY input_data, JSAMPARRAY * output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int outrow;

  for (outrow = 0; outrow < cinfo->max_v_samp_factor; outrow++) {
    inptr = input_data[outrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;	/* don't need GETJSAMPLE() here */
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
  }
}